

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fFboColorbufferTests.cpp
# Opt level: O2

Vector<float,_4> __thiscall
deqp::gles3::Functional::randomVector<4>
          (Functional *this,Random *rnd,Vector<float,_4> *minVal,Vector<float,_4> *maxVal)

{
  int ndx;
  long lVar1;
  float fVar2;
  float fVar3;
  undefined8 extraout_XMM0_Qa;
  undefined4 extraout_XMM0_Db;
  float fVar5;
  ulong in_XMM1_Qa;
  Vector<float,_4> VVar6;
  undefined8 uVar4;
  
  tcu::Vector<float,_4>::Vector((Vector<float,_4> *)this);
  uVar4 = extraout_XMM0_Qa;
  for (lVar1 = 0; lVar1 != 4; lVar1 = lVar1 + 1) {
    fVar3 = minVal->m_data[lVar1];
    fVar5 = maxVal->m_data[lVar1] - fVar3;
    in_XMM1_Qa = (ulong)(uint)fVar5;
    fVar2 = deRandom_getFloat(&rnd->m_rnd);
    fVar3 = fVar2 * fVar5 + fVar3;
    uVar4 = CONCAT44(extraout_XMM0_Db,fVar3);
    *(float *)(this + lVar1 * 4) = fVar3;
  }
  VVar6.m_data[2] = (float)(int)in_XMM1_Qa;
  VVar6.m_data[3] = (float)(int)(in_XMM1_Qa >> 0x20);
  VVar6.m_data[0] = (float)(int)uVar4;
  VVar6.m_data[1] = (float)(int)((ulong)uVar4 >> 0x20);
  return (Vector<float,_4>)VVar6.m_data;
}

Assistant:

static tcu::Vector<float, Size> randomVector (de::Random& rnd, const tcu::Vector<float, Size>& minVal = tcu::Vector<float, Size>(0.0f), const tcu::Vector<float, Size>& maxVal = tcu::Vector<float, Size>(1.0f))
{
	tcu::Vector<float, Size> res;
	for (int ndx = 0; ndx < Size; ndx++)
		res[ndx] = rnd.getFloat(minVal[ndx], maxVal[ndx]);
	return res;
}